

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O2

void __thiscall Pl_PNGFilter::decodeSub(Pl_PNGFilter *this)

{
  uchar *puVar1;
  uint uVar2;
  uchar *puVar3;
  ulong uVar4;
  uchar uVar5;
  
  puVar3 = this->cur_row;
  uVar2 = this->bytes_per_pixel;
  for (uVar4 = 0; uVar4 < this->bytes_per_row; uVar4 = uVar4 + 1) {
    if (uVar4 < uVar2) {
      uVar5 = '\0';
    }
    else {
      uVar5 = puVar3[(ulong)((int)uVar4 - uVar2) + 1];
    }
    puVar1 = puVar3 + uVar4 + 1;
    *puVar1 = *puVar1 + uVar5;
  }
  return;
}

Assistant:

void
Pl_PNGFilter::decodeSub()
{
    QTC::TC("libtests", "Pl_PNGFilter decodeSub");
    unsigned char* buffer = this->cur_row + 1;
    unsigned int bpp = this->bytes_per_pixel;

    for (unsigned int i = 0; i < this->bytes_per_row; ++i) {
        unsigned char left = 0;

        if (i >= bpp) {
            left = buffer[i - bpp];
        }

        buffer[i] = static_cast<unsigned char>(buffer[i] + left);
    }
}